

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormatSymbols::DecimalFormatSymbols
          (DecimalFormatSymbols *this,Locale *loc,UErrorCode *status)

{
  UnicodeString *local_90;
  UnicodeString *local_70;
  UnicodeString *local_38;
  UErrorCode *status_local;
  Locale *loc_local;
  DecimalFormatSymbols *this_local;
  
  memset(this,0,8);
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_004acc60;
  local_38 = (UnicodeString *)&this->field_0x8;
  do {
    UnicodeString::UnicodeString(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != &this->fNoSymbol);
  UnicodeString::UnicodeString(&this->fNoSymbol);
  Locale::Locale(&this->locale,loc);
  this->currPattern = (char16_t *)0x0;
  local_70 = (UnicodeString *)&this->field_0x978;
  do {
    UnicodeString::UnicodeString(local_70);
    local_70 = local_70 + 1;
  } while (local_70 != (UnicodeString *)&this->field_0xa38);
  local_90 = (UnicodeString *)&this->field_0xa38;
  do {
    UnicodeString::UnicodeString(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != (UnicodeString *)&this->fIsCustomCurrencySymbol);
  initialize(this,&this->locale,status,'\0',(NumberingSystem *)0x0);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols(const Locale& loc, UErrorCode& status)
        : UObject(), locale(loc), currPattern(NULL) {
    initialize(locale, status);
}